

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O2

ssize_t __thiscall amrex::BndryRegister::write(BndryRegister *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  FabSet *this_00;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string facename;
  
  poVar1 = (ostream *)(ulong)*(uint *)(ParallelContext::frames + 0xc);
  if (*(uint *)(ParallelContext::frames + 0xc) == 0) {
    BoxArray::writeOn(&this->grids,(ostream *)__buf);
    poVar1 = std::operator<<((ostream *)__buf,'\n');
  }
  this_00 = this->bndry;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000034,__fd),'_');
    __n_00 = 1;
    Concatenate(&facename,&local_70,(int)lVar2,1);
    std::__cxx11::string::~string((string *)&local_70);
    FabSet::write(this_00,(int)&facename,__buf_00,__n_00);
    poVar1 = (ostream *)std::__cxx11::string::~string((string *)&facename);
    this_00 = this_00 + 1;
  }
  return (ssize_t)poVar1;
}

Assistant:

void
BndryRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        grids.writeOn(os);
        os << '\n';
    }

    for (OrientationIter face; face; ++face)
    {
        //
        // Take name here and make a "new" name unique to each face.
        // Simplest thing would probably to append "_n" to the name,
        // where n is the integer value of face().
        //
        const int i = face();
        BL_ASSERT(i >= 0 && i <= 7);

        std::string facename = amrex::Concatenate(name + '_', i, 1);

        bndry[face()].write(facename);
    }
}